

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O0

void skipLine(char **pIn)

{
  char **pIn_local;
  
  while( true ) {
    if (**pIn == '\0') {
      return;
    }
    if (**pIn == '\n') break;
    *pIn = *pIn + 1;
  }
  *pIn = *pIn + 1;
  return;
}

Assistant:

static void skipLine( char ** pIn )
{
    while ( 1 )
    {
        if (**pIn == 0)
            return;
        if (**pIn == '\n')
        {
            (*pIn)++;
            return;
        }
        (*pIn)++;
    }
}